

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O1

void llama_sampler_dry_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  *this;
  pointer piVar1;
  long *plVar2;
  ring_buffer<int> *prVar3;
  uint uVar4;
  int iVar5;
  _Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false> it_1;
  uint *puVar6;
  int *piVar7;
  uint *puVar8;
  long *plVar9;
  long lVar10;
  mapped_type *pmVar11;
  __node_base_ptr p_Var12;
  _Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false> _Var13;
  int iVar14;
  size_t sVar15;
  ulong uVar16;
  int iVar17;
  _Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false> _Var18;
  uint uVar19;
  ulong uVar20;
  long *plVar21;
  _Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false> it;
  _Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false> _Var22
  ;
  _Hash_node_base *p_Var23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  size_t sVar27;
  bool bVar28;
  float fVar29;
  double dVar30;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>_>
  pVar31;
  llama_token token;
  uint local_a8;
  uint local_a4;
  ulong local_a0;
  _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  *local_98;
  uint *local_90;
  _Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false> local_88
  ;
  size_t local_80;
  ring_buffer<int> *local_78;
  uint local_6c;
  ulong local_68;
  size_t local_60;
  llama_token_data_array *local_58;
  ulong local_50;
  size_t local_48;
  vector<int,_std::allocator<int>_> *local_40;
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_38;
  
  local_58 = cur_p;
  puVar8 = (uint *)smpl->ctx;
  if (((((float)puVar8[1] != 0.0) || (NAN((float)puVar8[1]))) &&
      (1.0 < (float)puVar8[2] || (float)puVar8[2] == 1.0)) && (uVar4 = puVar8[4], uVar4 != 0)) {
    puVar6 = puVar8;
    if (uVar4 != 0xffffffff) {
      local_a4 = 0;
      puVar6 = puVar8 + 4;
      if ((int)uVar4 < 0) {
        puVar6 = &local_a4;
      }
    }
    local_a8 = puVar8[0x2a];
    if ((int)*puVar6 < (int)puVar8[0x2a]) {
      local_a8 = *puVar6;
    }
    if ((int)*puVar8 < (int)local_a8) {
      local_a8 = *puVar8;
    }
    uVar25 = (ulong)local_a8;
    if ((int)puVar8[3] < (int)local_a8) {
      local_78 = (ring_buffer<int> *)(puVar8 + 0x28);
      local_40 = (vector<int,_std::allocator<int>_> *)(puVar8 + 0x14);
      local_a4 = 0;
      std::vector<int,_std::allocator<int>_>::_M_fill_assign
                (local_40,(long)(int)local_a8,(value_type_conflict3 *)&local_a4);
      local_38 = (_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(puVar8 + 0x1a);
      std::
      _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(local_38);
      local_a0 = uVar25;
      local_90 = puVar8;
      if (0 < (int)local_a8) {
        local_98 = (_Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                    *)(puVar8 + 6);
        local_60 = 0xffffffffffffffff;
        sVar27 = 0;
        local_68 = uVar25;
        do {
          puVar6 = (uint *)ring_buffer<int>::rat(local_78,sVar27);
          local_a4 = *puVar6;
          pVar31 = std::
                   _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                   ::equal_range(local_98,(key_type *)&local_a4);
          if ((__node_type *)
              pVar31.first.
              super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            bVar28 = false;
          }
          else {
            uVar25 = 0xffffffff;
            iVar14 = -1;
            _Var18 = pVar31.second.
                     super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                     ._M_cur.
                     super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
            ;
            sVar15 = sVar27;
            if ((_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                 )pVar31.first.
                  super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                  ._M_cur !=
                pVar31.second.
                super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                ._M_cur.
                super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
               ) {
              do {
                local_80 = sVar15;
                local_88._M_cur = _Var18._M_cur;
                _Var13._M_cur =
                     (__node_type *)
                     pVar31.second.
                     super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                     ._M_cur;
                _Var22 = pVar31.first.
                         super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                         ._M_cur;
                uVar26 = (ulong)(*(long *)((long)_Var22.
                                                 super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                                 ._M_cur + 0x18) -
                                *(long *)((long)_Var22.
                                                super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                                ._M_cur + 0x10)) >> 2;
                uVar4 = (uint)uVar26;
                if (((int)uVar25 < (int)uVar4) && ((long)(int)uVar4 <= (long)sVar27)) {
                  if ((int)uVar4 < 1) {
                    uVar25 = uVar26 & 0xffffffff;
                  }
                  else {
                    local_50 = CONCAT44(local_50._4_4_,(int)uVar25);
                    uVar25 = 0;
                    sVar15 = local_60;
                    do {
                      iVar14 = *(int *)(*(long *)((long)_Var22.
                                                  super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                                  ._M_cur + 0x10) + uVar25 * 4);
                      piVar7 = ring_buffer<int>::rat(local_78,sVar15);
                      _Var13 = local_88;
                      sVar27 = local_80;
                      if (iVar14 != *piVar7) {
                        uVar25 = local_50 & 0xffffffff;
                        goto LAB_0020ee3b;
                      }
                      uVar25 = uVar25 + 1;
                      sVar15 = sVar15 - 1;
                    } while ((uVar4 & 0x7fffffff) != uVar25);
                    uVar25 = uVar26 & 0xffffffff;
                  }
                }
LAB_0020ee3b:
                iVar14 = (int)uVar25;
                pVar31.second.
                super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                ._M_cur = (_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                           )(_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                             )_Var13._M_cur;
                pVar31.first.
                super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                ._M_cur = (_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                           )*(_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                              *)_Var22.
                                super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                ._M_cur;
                _Var18._M_cur = local_88._M_cur;
                sVar15 = local_80;
              } while ((__node_type *)
                       *(_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                         *)_Var22.
                           super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                           ._M_cur != _Var13._M_cur);
            }
            bVar28 = -1 < iVar14;
            puVar8 = local_90;
            if (bVar28) {
              local_a8 = (int)sVar27 - iVar14;
            }
          }
          if (bVar28) break;
          sVar27 = sVar27 + 1;
          local_60 = local_60 + 1;
        } while (sVar27 != local_68);
      }
      iVar14 = (int)local_a0;
      if ((int)puVar8[3] <= (int)local_a8) {
        uVar4 = iVar14 - 1;
        local_6c = uVar4;
        if (1 < iVar14) {
          local_50 = local_a0 & 0xffffffff;
          local_68 = (ulong)(int)uVar4;
          local_60 = 0;
          uVar16 = 1;
          _Var18._M_cur = (__node_type *)0xffffffff;
          uVar20 = local_a0 & 0xffffffff;
          iVar17 = 0;
          uVar25 = 0;
          uVar26 = local_a0;
          do {
            uVar19 = (int)uVar20 - 1;
            uVar20 = (ulong)uVar19;
            iVar14 = (int)uVar16;
            if ((long)iVar17 < (long)uVar16) {
              local_48 = CONCAT44(local_48._4_4_,(int)uVar25);
              local_80 = CONCAT44(local_80._4_4_,iVar17);
              local_98 = (_Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                          *)CONCAT44(local_98._4_4_,uVar19);
              sVar27 = 0;
              local_88._M_cur = _Var18._M_cur;
              do {
                prVar3 = local_78;
                piVar7 = ring_buffer<int>::rat(local_78,sVar27);
                iVar14 = *piVar7;
                piVar7 = ring_buffer<int>::rat(prVar3,sVar27 + uVar16);
                if (iVar14 != *piVar7) {
                  iVar14 = (int)sVar27 - (int)local_88._M_cur;
                  goto LAB_0020efe5;
                }
                sVar27 = sVar27 + 1;
              } while (uVar4 != sVar27);
              sVar27 = (ulong)local_98 & 0xffffffff;
              iVar14 = (int)local_a0;
LAB_0020efe5:
              uVar20 = (ulong)local_98 & 0xffffffff;
              uVar24 = (uint)sVar27;
              uVar19 = uVar24;
              if ((int)local_a8 < (int)uVar24) {
                uVar19 = local_a8;
              }
              (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[local_68 - uVar16] = uVar19;
              uVar25 = local_48;
              if (uVar24 != 0) {
                uVar25 = uVar16;
              }
              uVar25 = uVar25 & 0xffffffff;
              uVar26 = local_a0;
              _Var18._M_cur = local_88._M_cur;
              iVar17 = (int)local_80;
              if (uVar24 != 0) {
                iVar17 = iVar14 + -1;
              }
            }
            else {
              piVar1 = (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar24 = piVar1[(int)((local_6c - iVar14) + (int)uVar25)];
              if (iVar17 - iVar14 < (int)uVar24) {
                local_98 = (_Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                            *)CONCAT44(local_98._4_4_,uVar19);
                local_48 = (size_t)(iVar17 + 1U);
                if ((int)(iVar17 + 1U) < (int)uVar26) {
                  local_48 = uVar26 & 0xffffffff;
                }
                local_80 = CONCAT44(local_80._4_4_,(int)local_48 + -1);
                sVar27 = (long)iVar17;
                local_88._M_cur = _Var18._M_cur;
                do {
                  prVar3 = local_78;
                  sVar15 = sVar27 + 1;
                  if ((long)local_50 <= (long)sVar15) {
                    sVar15 = local_48;
                    goto LAB_0020f03a;
                  }
                  piVar7 = ring_buffer<int>::rat(local_78,sVar15);
                  iVar17 = *piVar7;
                  piVar7 = ring_buffer<int>::rat(prVar3,sVar27 + local_60);
                  sVar27 = sVar15;
                } while (iVar17 == *piVar7);
                local_80 = CONCAT44(local_80._4_4_,(int)sVar15 + -1);
LAB_0020f03a:
                uVar20 = (ulong)(uint)local_98;
                uVar19 = (int)sVar15 - iVar14;
                if ((int)local_a8 < (int)uVar19) {
                  uVar19 = local_a8;
                }
                (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[local_68 - uVar16] = uVar19;
                uVar25 = uVar16 & 0xffffffff;
                uVar26 = local_a0;
                _Var18._M_cur = local_88._M_cur;
                iVar17 = (int)local_80;
              }
              else {
                if ((int)local_a8 < (int)uVar24) {
                  uVar24 = local_a8;
                }
                piVar1[local_68 - uVar16] = uVar24;
              }
            }
            iVar14 = (int)uVar26;
            uVar16 = uVar16 + 1;
            local_60 = local_60 - 1;
            _Var18._M_cur =
                 (__node_type *)
                 &(&_Var18._M_cur[-1].
                    super__Hash_node_value<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                    .
                    super__Hash_node_value_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                    ._M_storage._M_storage.__align)[3].field_0x7;
            uVar4 = uVar4 - 1;
          } while (uVar16 != local_50);
        }
        if (1 < iVar14) {
          local_a0 = (ulong)((int)local_a0 - 2);
          uVar25 = (ulong)local_6c;
          uVar26 = 0;
          do {
            iVar14 = *(int *)(*(long *)(local_90 + 0x14) + uVar26 * 4);
            if ((int)local_90[3] <= iVar14) {
              puVar8 = (uint *)ring_buffer<int>::rat(local_78,(long)((int)local_a0 - (int)uVar26));
              local_a4 = *puVar8;
              uVar16 = (ulong)(long)(int)local_a4 % *(ulong *)(local_90 + 0x1c);
              plVar2 = *(long **)(*(long *)(local_90 + 0x1a) + uVar16 * 8);
              plVar9 = (long *)0x0;
              if ((plVar2 != (long *)0x0) &&
                 (plVar9 = plVar2, plVar21 = (long *)*plVar2,
                 local_a4 != *(uint *)((long *)*plVar2 + 1))) {
                while (plVar2 = (long *)*plVar21, plVar2 != (long *)0x0) {
                  plVar9 = (long *)0x0;
                  if (((ulong)(long)(int)*(uint *)(plVar2 + 1) % *(ulong *)(local_90 + 0x1c) !=
                       uVar16) ||
                     (plVar9 = plVar21, plVar21 = plVar2, local_a4 == *(uint *)(plVar2 + 1)))
                  goto LAB_0020f137;
                }
                plVar9 = (long *)0x0;
              }
LAB_0020f137:
              if (plVar9 == (long *)0x0) {
                lVar10 = 0;
              }
              else {
                lVar10 = *plVar9;
              }
              if ((lVar10 == 0) || (*(int *)(lVar10 + 0xc) < iVar14)) {
                pmVar11 = std::__detail::
                          _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)local_38,(key_type *)&local_a4);
                *pmVar11 = iVar14;
              }
            }
            uVar26 = uVar26 + 1;
          } while (uVar26 != uVar25);
        }
        iVar14 = 0;
        if (1.000001 < (float)local_90[2]) {
          fVar29 = logf((float)local_90[2]);
          iVar14 = (int)(88.72284 / fVar29);
        }
        if (local_58->size != 0) {
          this = (_Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                  *)(local_90 + 6);
          uVar25 = 0;
          do {
            uVar26 = (ulong)local_58->data[uVar25].id;
            p_Var12 = std::
                      _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::_M_find_before_node
                                (local_38,uVar26 % *(ulong *)(local_90 + 0x1c),
                                 &local_58->data[uVar25].id,uVar26);
            p_Var23 = (_Hash_node_base *)0x0;
            if (p_Var12 != (__node_base_ptr)0x0) {
              p_Var23 = p_Var12->_M_nxt;
            }
            if (p_Var23 != (_Hash_node_base *)0x0) {
              pVar31 = std::
                       _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                       ::equal_range(this,&local_58->data[uVar25].id);
              for (_Var18._M_cur =
                        (__node_type *)
                        pVar31.first.
                        super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                        ._M_cur;
                  (_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                   )_Var18._M_cur !=
                  pVar31.second.
                  super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                  ._M_cur.
                  super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                  ; _Var18._M_cur = (__node_type *)((_Var18._M_cur)->super__Hash_node_base)._M_nxt)
              {
                if (*(long *)((long)&((_Var18._M_cur)->
                                     super__Hash_node_value<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                     ).
                                     super__Hash_node_value_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_storage._M_storage + 8) ==
                    *(long *)((long)&((_Var18._M_cur)->
                                     super__Hash_node_value<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                     ).
                                     super__Hash_node_value_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_storage._M_storage + 0x10)) goto LAB_0020f27e;
              }
              iVar5 = *(int *)((long)&p_Var23[1]._M_nxt + 4) - local_90[3];
              iVar17 = iVar14;
              if (iVar5 < iVar14) {
                iVar17 = iVar5;
              }
              if (iVar14 < 1) {
                iVar17 = iVar5;
              }
              local_78 = (ring_buffer<int> *)(double)(float)local_90[1];
              dVar30 = pow((double)(float)local_90[2],(double)iVar17);
              local_58->data[uVar25].logit =
                   local_58->data[uVar25].logit - (float)(dVar30 * (double)local_78);
            }
LAB_0020f27e:
            uVar25 = uVar25 + 1;
          } while (uVar25 < local_58->size);
        }
        local_58->sorted = false;
      }
    }
  }
  return;
}

Assistant:

static void llama_sampler_dry_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    auto * ctx = (llama_sampler_dry *) smpl->ctx;

    if (ctx->dry_multiplier == 0.0f || ctx->dry_base < 1.0f || ctx->dry_penalty_last_n == 0) {
        return;
    }

    int32_t effective_dry_penalty_last_n = (ctx->dry_penalty_last_n == -1) ? ctx->total_context_size : std::max(ctx->dry_penalty_last_n, 0);
    int last_n_repeat = std::min(std::min((int)ctx->last_tokens.size(), effective_dry_penalty_last_n), ctx->total_context_size);

    if (last_n_repeat <= ctx->dry_allowed_length) {
        return;
    }

    ctx->dry_repeat_count.assign(last_n_repeat, 0);
    ctx->dry_max_token_repeat.clear();

    // Step 1: Look for restart sequences to limit the maximum repetition length.
    // Work backwards through the context looking for any token that begins a restart sequence.
    //
    // The collection `restart_sequences` is a mapping from a "head" token to all "tail"
    // sequences that together comprise a restart sequence. This allows us to quickly check
    // whether each token is the head of a complete sequence. Most restart sequences are actually
    // a single token, and for these the "tail" is an empty vector.
    //
    // If the token is a "head", test all restart sequences that begin with this token
    // (there will often only be one sequence for each token, but if sequences like 'aaaq1' and
    // 'aaa1' are used as restart strings, both could start with 'aaa' when tokenized). The
    // longest matching sequence (if any) is used to limit the maximum repetition length.
    //
    // Note that in the case case of a short sequence contained in a longer one, this might fail to
    // find the smallest value for `rep_limit`. For example, if 'amniotic' and 'ni' are both used as
    // restart sequences, 'ni' will be found first, and since it's shorter it will fail to suppress
    // 'otic'. This is a minor issue since fully contained restart sequences are likely to be rare.
    //
    // This is theoretically worst-case O(N^2) for arbitrary restart sequences, which is why we
    // have already clamped the maximum tail sequence length when generating `restart_sequences`.
    // With clamping, this scan is O(N) in the context length.

    int rep_limit = last_n_repeat;
    for (int i = 0; i < last_n_repeat; ++i) {
        llama_token token = ctx->last_tokens.rat(i);
        auto its = ctx->dry_processed_breakers.equal_range(token);
        if (its.first == ctx->dry_processed_breakers.end()) {
            continue;
        }
        int longest_match = -1;
        for (auto it = its.first; it != its.second; ++it) {
            // Note that (*it) does not contain the head character, so seq_len will be
            // the restart sequence length minus 1.
            // In the common case of a single-token restart sequence, (*it) will be empty
            // and we will trivially match.
            int seq_len = (int)it->second.size();
            if (seq_len > longest_match && seq_len <= (int)i) {
                bool match = true;
                for (int offset = 0; offset < seq_len; ++offset) {
                    // The -1 when indexing `last_tokens` is because we already matched the head.
                    if (it->second[offset] != ctx->last_tokens.rat(i - offset - 1)) {
                        match = false;
                        break;
                    }
                }
                if (match) {
                    longest_match = seq_len;
                }
            }
        }
        if (longest_match >= 0) {
            // We found a restart sequence starting `i` tokens from the end and continuing for
            // `longest_match` tokens.
            rep_limit = i - longest_match;
            break;
        }
    }
    if (rep_limit < ctx->dry_allowed_length) {
        return;
    }

    // Step 2: Iterate in reverse over the last N tokens of the context, using the "Z-algorithm" (in
    // the reverse direction) to efficiently compute the positions and lengths of suffixes appearing
    // elsewhere in the context. We limit the suffix length to `rep_limit` to respect restart sequences.
    //
    // This algorithm is not currently documented on Wikipedia, but there is a clear description here:
    // https://ivanyu.me/blog/2014/10/15/z-algorithm/
    //
    // The code below is adapted from the public domain implementation by the same author here:
    // https://github.com/ivanyu/string-algorithms/blob/master/z_algorithm.py
    //
    // Example:
    // Last N tokens: a b c c b c y a b c
    // Repeat counts: 0 0 3 1 0 2 0 0 0 0
    //                    ^
    //   This `3` means that the last three tokens of the context (a b c) also appear here.
    //
    // This step is worst case O(N) since the Z-algorithm is linear, despite the appearance of nested
    // for/while loops. This can be seen by observing that the `lt` and `rt` bounds are set after each
    // repeated suffix is detected (i.e. after each while loop when n > 0). These bound variables
    // ensure that the inner while loops only examine each token in the context once as the outer
    // for loop iterates over the context.

    {
        const int last = last_n_repeat - 1;
        int rt = 0, lt = 0;

        for (int k = 1; k < last_n_repeat; ++k) {
            if (k > rt) {
                // If k is outside the current Z-box, do naive computation.
                int n = 0;
                while (n + k < last_n_repeat && ctx->last_tokens.rat(n) == ctx->last_tokens.rat(n+k)) {
                    ++n;
                }
                ctx->dry_repeat_count[last - k] = std::min(n, rep_limit);
                if (n > 0) {
                    lt = k;
                    rt = k + n - 1;
                }
            } else {
                // If k is inside the current Z-box, consider two cases.

                int p = k - lt; // Pair index.
                int right_part_len = rt - k + 1;

                if (ctx->dry_repeat_count[last - p] < right_part_len) {
                    int n = std::min(ctx->dry_repeat_count[last - p], rep_limit);
                    ctx->dry_repeat_count[last - k] = n;
                } else {
                    int i = rt + 1;
                    while (i < last_n_repeat && ctx->last_tokens.rat(i) == ctx->last_tokens.rat(i - k)) {
                        i += 1;
                    }

                    int n = std::min(i - k, rep_limit);
                    ctx->dry_repeat_count[last - k] = n;
                    lt = k;
                    rt = i - 1;
                }
            }
        }
    }

    // Step 3: Iterate over dry_repeat_count and last_tokens, examining the maximum repeat length
    // that would be generated by emitting each new token that would extend a sequence.
    //
    // Following the same example as above:
    // Last N tokens: a b c c b c y a b c
    // Repeat counts: 0 0 3 1 0 2 0 0 0 0
    //
    // For each non-zero, look ahead one token. This token, if emitted, would extend the repetition.
    // c: 3 -> 4 (from `a b c` to `a b c c`)
    // b: 1 -> 2 (from `c` to `c b`)
    // y: 2 -> 3 (from `b c` to `b c y`)

    for (int i = 0; i < last_n_repeat - 1; ++i) {
        int repeat_len = ctx->dry_repeat_count[i];
        if (repeat_len >= ctx->dry_allowed_length) {
            // This token ends a repeat, so the next token would continue one.
            // By convention, the value of `repeat_len` only includes the tokens currently
            // in the context, not the new token that would be added.
            llama_token token = ctx->last_tokens.rat(last_n_repeat - 2 - i);
            // Track the maximum sequence ending in this token.
            const auto& it = ctx->dry_max_token_repeat.find(token);
            if (it == ctx->dry_max_token_repeat.end() || it->second < repeat_len) {
                ctx->dry_max_token_repeat[token] = repeat_len;
            }
        }
    }

    // Step 4: Apply logit penalties based on the maximum repeat length for relevant tokens.

    // Prevent floating point overflow in `pow(penalty_base, exponent)` by clamping to `max_exponent`.
    // Compute it from `penalty_base` and the approximate log of `std::numeric_limits<float>::max()`
    const float FLOAT_MAX_LOG = 88.7228391f;
    int max_exponent = 0;
    if (ctx->dry_base > 1.000001f) {
        max_exponent = FLOAT_MAX_LOG / std::log(ctx->dry_base);
    }

    for (size_t i = 0; i < cur_p->size; ++i) {
        const auto& af_kvp = ctx->dry_max_token_repeat.find(cur_p->data[i].id);
        if (af_kvp != ctx->dry_max_token_repeat.end()) {
            // Check all sequence breakers starting with this token
            auto range = ctx->dry_processed_breakers.equal_range(cur_p->data[i].id);
            bool is_single_token_breaker = false;

            for (auto it = range.first; it != range.second; ++it) {
                if (it->second.empty()) {
                    is_single_token_breaker = true;
                    break;
                }
            }

            // Apply penalty only if it's not a single-token sequence breaker
            if (!is_single_token_breaker) {
                int repeat_exp = af_kvp->second - ctx->dry_allowed_length;
                if (max_exponent > 0 && repeat_exp > max_exponent) {
                    repeat_exp = max_exponent;
                }
                float penalty = ctx->dry_multiplier * std::pow(ctx->dry_base, repeat_exp);
                cur_p->data[i].logit -= penalty;
            }
        }
    }

    cur_p->sorted = false;
}